

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_poll_impl.cc
# Opt level: O0

void __thiscall iqnet::Reactor_poll_impl::reset(Reactor_poll_impl *this,HandlerStateList *in)

{
  bool bVar1;
  pointer pHVar2;
  ushort uVar3;
  value_type local_34;
  pollfd sfd;
  short events;
  _Self local_20;
  const_iterator i;
  HandlerStateList *in_local;
  Reactor_poll_impl *this_local;
  
  i._M_node = (_List_node_base *)in;
  std::vector<pollfd,_std::allocator<pollfd>_>::clear(&this->impl->pfd);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
       begin(i._M_node);
  while( true ) {
    register0x00000000 =
         std::__cxx11::
         list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
         ::end(i._M_node);
    bVar1 = std::operator!=(&local_20,(_Self *)&sfd.events);
    if (!bVar1) break;
    pHVar2 = std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_20);
    sfd.fd._2_2_ = (ushort)((pHVar2->mask & 1U) != 0);
    pHVar2 = std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_20);
    uVar3 = 0;
    if ((pHVar2->mask & 2U) != 0) {
      uVar3 = 4;
    }
    sfd.fd._2_2_ = sfd.fd._2_2_ | uVar3;
    pHVar2 = std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_20);
    local_34.fd = pHVar2->fd;
    local_34.events = sfd.fd._2_2_;
    local_34.revents = 0;
    std::vector<pollfd,_std::allocator<pollfd>_>::push_back(&this->impl->pfd,&local_34);
    std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::operator++(&local_20);
  }
  return;
}

Assistant:

void Reactor_poll_impl::reset(const HandlerStateList& in)
{
  impl->pfd.clear();

  for( HandlerStateList::const_iterator i = in.begin(); i != in.end(); ++i )
  {
    short events = i->mask & Reactor_base::INPUT ? POLLIN : 0;
    events |= i->mask & Reactor_base::OUTPUT ? POLLOUT : 0;
    struct pollfd sfd = { i->fd, events, 0 };
    impl->pfd.push_back( sfd );
  }
}